

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::operator=
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          unsigned_short *val)

{
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_unsigned_short,_void>
  ::to_json((unsigned_short)((ulong)in_RDI >> 0x30));
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffffe0,in_RDI);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x357861);
  return in_RDI;
}

Assistant:

basic_json& operator=(const T& val)
        {
            *this = json_type_traits<basic_json,T>::to_json(val);
            return *this;
        }